

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_syntaxv(FILE *fp,void **argtable,char *suffix)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  long lVar4;
  char *__format;
  int iVar5;
  char syntax [200];
  char *in_stack_fffffffffffffef8;
  char local_f8 [200];
  
  lVar4 = 0;
  while ((pbVar2 = (byte *)argtable[lVar4], pbVar2 != (byte *)0x0 && ((*pbVar2 & 1) == 0))) {
    iVar5 = 0;
    memset(local_f8,0,200);
    arg_cat_optionv(local_f8,*(size_t *)(pbVar2 + 8),*(char **)(pbVar2 + 0x10),
                    *(char **)(pbVar2 + 0x18),(char *)(ulong)(*pbVar2 & 4),0x10a632,
                    in_stack_fffffffffffffef8);
    while( true ) {
      iVar1 = *(int *)((long)argtable[lVar4] + 0x28);
      if (iVar1 <= iVar5) break;
      fprintf((FILE *)fp," %s",local_f8);
      iVar5 = iVar5 + 1;
    }
    iVar5 = *(int *)((long)argtable[lVar4] + 0x2c);
    iVar3 = iVar5 - iVar1;
    if (iVar5 != iVar1) {
      if (iVar3 == 2) {
        fprintf((FILE *)fp," [%s] [%s]",local_f8,local_f8);
      }
      else {
        if (iVar3 == 1) {
          __format = " [%s]";
        }
        else {
          __format = " [%s]...";
        }
        fprintf((FILE *)fp,__format,local_f8);
      }
    }
    lVar4 = lVar4 + 1;
  }
  if (suffix != (char *)0x0) {
    fputs(suffix,(FILE *)fp);
  }
  return;
}

Assistant:

void arg_print_syntaxv(FILE * fp, void * *argtable, const char * suffix) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int i, tabindex;

	/* print remaining options in abbreviated style */
	for (tabindex = 0;
			table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR);
			tabindex++) {
		char syntax[200] = "";
		const char * shortopts, *longopts, *datatype;

		shortopts = table[tabindex]->shortopts;
		longopts  = table[tabindex]->longopts;
		datatype  = table[tabindex]->datatype;
		arg_cat_optionv(syntax,
						sizeof(syntax),
						shortopts,
						longopts,
						datatype,
						table[tabindex]->flag & ARG_HASOPTVALUE,
						"|");

		/* print mandatory options */
		for (i = 0; i < table[tabindex]->mincount; i++) {
			fprintf(fp, " %s", syntax);
		}

		/* print optional args enclosed in "[..]" */
		switch ( table[tabindex]->maxcount - table[tabindex]->mincount ) {
			case 0:
				break;

			case 1:
				fprintf(fp, " [%s]", syntax);
				break;

			case 2:
				fprintf(fp, " [%s] [%s]", syntax, syntax);
				break;

			default:
				fprintf(fp, " [%s]...", syntax);
				break;
		}
	}

	if (suffix) {
		fprintf(fp, "%s", suffix);
	}
}